

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O0

void __thiscall ASTree::ASTree(ASTree *this)

{
  allocator<char> local_35 [20];
  allocator<ASTree_*> local_21;
  initializer_list<ASTree_*> local_20;
  ASTree *local_10;
  ASTree *this_local;
  
  local_10 = this;
  std::initializer_list<ASTree_*>::initializer_list(&local_20);
  std::allocator<ASTree_*>::allocator(&local_21);
  std::vector<ASTree_*,_std::allocator<ASTree_*>_>::vector(&this->subtrees,local_20,&local_21);
  std::allocator<ASTree_*>::~allocator(&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->root,"",local_35);
  std::allocator<char>::~allocator(local_35);
  this->parent = (ASTree *)0x0;
  return;
}

Assistant:

ASTree::ASTree() : root(""), parent(nullptr), subtrees({}) {

}